

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableDatum.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::VariableDatum::GetDatumValueCopyIntoBuffer
          (VariableDatum *this,KOCTET *Buffer,KUINT16 BufferSize)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  KException *this_00;
  pointer pDVar4;
  undefined6 in_register_00000012;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  double dVar8;
  KString local_40;
  
  dVar8 = ceil((double)this->m_ui32DatumLength * 0.125);
  uVar3 = (uint)(long)dVar8;
  if ((uint)CONCAT62(in_register_00000012,BufferSize) < uVar3) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"GetDatumValueCopyIntoBuffer","");
    KException::KException(this_00,&local_40,1);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  if (uVar3 != 0) {
    pDVar4 = (this->m_v8DatumValue).
             super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = 0;
    do {
      if ((uint)(uVar5 & 0xffff) < uVar3) {
        uVar6 = 0;
        do {
          uVar2 = (uVar5 & 0xffff) + uVar6;
          Buffer[uVar2 & 0xffff] = pDVar4->Buffer[uVar6];
          uVar1 = uVar6 + 1;
          if (uVar3 <= ((int)uVar2 + 1U & 0xffff)) break;
          bVar7 = uVar6 < 7;
          uVar6 = uVar1;
        } while (bVar7);
        uVar5 = (ulong)(uint)((int)uVar1 + (int)uVar5);
      }
      pDVar4 = pDVar4 + 1;
    } while ((ushort)uVar5 < (ushort)(long)dVar8);
  }
  return;
}

Assistant:

void VariableDatum::GetDatumValueCopyIntoBuffer(KOCTET *Buffer, KUINT16 BufferSize) const noexcept(false)
{
    KUINT32 sizeInOctets = ceil( m_ui32DatumLength / 8.0 );

    if( BufferSize < sizeInOctets )throw KException( __FUNCTION__, BUFFER_TOO_SMALL );

    // Copy the data into the buffer, octet by octet
    vector<DatumEntry>::const_iterator citr = m_v8DatumValue.begin();

    KUINT16 i = 0;

    while( i < sizeInOctets )
    {
        for( KUINT16 j = 0; i < sizeInOctets && j < 8; ++j, ++i )
        {
            Buffer[i] = citr->Buffer[j];
        }
        ++citr;
    }
}